

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CliffordLib.cpp
# Opt level: O2

void CtoE(Clifford *p)

{
  float tv;
  vector<Blade,_std::allocator<Blade>_> local_e8;
  vector<Blade,_std::allocator<Blade>_> local_d0;
  vector<Blade,_std::allocator<Blade>_> local_b8;
  Clifford local_a0;
  Clifford local_88;
  vector<Blade,_std::allocator<Blade>_> local_70;
  vector<Blade,_std::allocator<Blade>_> local_58;
  Clifford local_40;
  Clifford local_28;
  
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_58,p);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_70,&e);
  operator|(&local_40,&local_58,&local_70);
  if (local_40.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_40.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    tv = 0.0;
  }
  else {
    tv = (local_40.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data
         ._M_start)->mVal;
  }
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_40);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_70);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_58);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_b8,&Ie);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_d0,p);
  operator|(&local_a0,&local_b8,&local_d0);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_e8,&Ie);
  operator|(&local_88,&local_a0,&local_e8);
  operator/(&local_28,&local_88,tv);
  std::vector<Blade,_std::allocator<Blade>_>::_M_move_assign(p,&local_28);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_28);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_88);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_e8);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_a0);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_d0);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_b8);
  return;
}

Assistant:

void CtoE(Clifford &p)
{
  float n;n<=(p|e);
  p=(Ie|p|Ie)/n;
}